

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAutoHandle.cxx
# Opt level: O0

void __thiscall auto_handle_base_<uv_handle_s>::reset(auto_handle_base_<uv_handle_s> *this)

{
  int iVar1;
  uv_handle_t *puVar2;
  auto_handle_base_<uv_handle_s> *this_local;
  
  if (this->handle != (uv_handle_s *)0x0) {
    puVar2 = ::auto_handle_base_::operator_cast_to_uv_handle_s_((auto_handle_base_ *)this);
    iVar1 = uv_is_closing(puVar2);
    if (iVar1 != 0) {
      __assert_fail("!uv_is_closing(*this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmAutoHandle.cxx"
                    ,0x20,"virtual void auto_handle_base_<uv_handle_s>::reset() [T = uv_handle_s]");
    }
    puVar2 = ::auto_handle_base_::operator_cast_to_uv_handle_s_((auto_handle_base_ *)this);
    iVar1 = uv_is_closing(puVar2);
    if (iVar1 == 0) {
      puVar2 = ::auto_handle_base_::operator_cast_to_uv_handle_s_((auto_handle_base_ *)this);
      uv_close(puVar2,close_delete<uv_handle_s>);
    }
    this->handle = (uv_handle_s *)0x0;
  }
  return;
}

Assistant:

void auto_handle_base_<T>::reset()
{
  if (handle) {
    assert(!uv_is_closing(*this));
    if (!uv_is_closing(*this)) {
      uv_close(*this, &close_delete<T>);
    }
    handle = CM_NULLPTR;
  }
}